

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O3

void __thiscall
TEST_ComparatorsAndCopiersRepository_InstallCopierAndRetrieveIt_Test::testBody
          (TEST_ComparatorsAndCopiersRepository_InstallCopierAndRetrieveIt_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueCopier *pMVar2;
  TestTerminator *pTVar3;
  MockNamedValueComparatorsAndCopiersRepository repository;
  MyCopier copier;
  SimpleString local_38;
  MockNamedValueComparatorsAndCopiersRepository local_28;
  MockNamedValueCopier local_18;
  
  local_18._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002ca0c8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_28);
  SimpleString::SimpleString(&local_38,"MyType");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_28,&local_38,&local_18);
  SimpleString::~SimpleString(&local_38);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"MyType");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_28,&local_38);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_18,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
             ,0x3d,pTVar3);
  SimpleString::~SimpleString(&local_38);
  MockNamedValueComparatorsAndCopiersRepository::clear(&local_28);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_28);
  return;
}

Assistant:

MyCopier() {}